

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void ggml_vec_dot_tq2_0_q8_K(int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256 x_00;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 (*pauVar10) [32];
  long in_RCX;
  float *in_RSI;
  int in_EDI;
  long in_R9;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  __m256 d;
  __m256i ysum;
  __m256i qy3;
  __m256i qy2;
  __m256i qy1;
  __m256i qy0;
  __m256i qx3;
  __m256i qx2;
  __m256i qx1;
  __m256i qx0;
  size_t j;
  __m256i sumi1;
  __m256i sumi0;
  int i;
  __m256 sumf;
  int nb;
  block_q8_K *y;
  block_tq2_0 *x;
  undefined2 in_stack_fffffffffffff618;
  undefined2 in_stack_fffffffffffff61a;
  undefined1 in_stack_fffffffffffff61c;
  undefined1 in_stack_fffffffffffff61d;
  undefined1 in_stack_fffffffffffff61e;
  undefined1 in_stack_fffffffffffff61f;
  undefined8 in_stack_fffffffffffff620;
  undefined8 in_stack_fffffffffffff628;
  undefined8 in_stack_fffffffffffff630;
  undefined8 local_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined4 local_824;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if (in_EDI < 0) {
    in_EDI = in_EDI + 0xff;
  }
  for (local_824 = 0; local_824 < in_EDI >> 8; local_824 = local_824 + 1) {
    local_860 = ZEXT1632(ZEXT816(0));
    local_880 = ZEXT1632(ZEXT816(0));
    for (local_888 = 0; local_888 < 0x40; local_888 = local_888 + 0x20) {
      pauVar10 = (undefined1 (*) [32])(in_RCX + (long)local_824 * 0x42 + local_888);
      auVar4 = vpsrlw_avx2(*pauVar10,ZEXT416(2));
      auVar5 = vpsrlw_avx2(*pauVar10,ZEXT416(4));
      auVar6 = vpsrlw_avx2(*pauVar10,ZEXT416(6));
      in_stack_fffffffffffff61c = 3;
      auVar1 = vpinsrb_avx(ZEXT116(3),3,1);
      auVar1 = vpinsrb_avx(auVar1,3,2);
      auVar1 = vpinsrb_avx(auVar1,3,3);
      auVar1 = vpinsrb_avx(auVar1,3,4);
      auVar1 = vpinsrb_avx(auVar1,3,5);
      auVar1 = vpinsrb_avx(auVar1,3,6);
      auVar1 = vpinsrb_avx(auVar1,3,7);
      auVar1 = vpinsrb_avx(auVar1,3,8);
      auVar1 = vpinsrb_avx(auVar1,3,9);
      auVar1 = vpinsrb_avx(auVar1,3,10);
      auVar1 = vpinsrb_avx(auVar1,3,0xb);
      auVar1 = vpinsrb_avx(auVar1,3,0xc);
      auVar1 = vpinsrb_avx(auVar1,3,0xd);
      auVar1 = vpinsrb_avx(auVar1,3,0xe);
      auVar1 = vpinsrb_avx(auVar1,3,0xf);
      auVar2 = vpinsrb_avx(ZEXT116(3),3,1);
      auVar2 = vpinsrb_avx(auVar2,3,2);
      auVar2 = vpinsrb_avx(auVar2,3,3);
      auVar2 = vpinsrb_avx(auVar2,3,4);
      auVar2 = vpinsrb_avx(auVar2,3,5);
      auVar2 = vpinsrb_avx(auVar2,3,6);
      auVar2 = vpinsrb_avx(auVar2,3,7);
      auVar2 = vpinsrb_avx(auVar2,3,8);
      auVar2 = vpinsrb_avx(auVar2,3,9);
      auVar2 = vpinsrb_avx(auVar2,3,10);
      auVar2 = vpinsrb_avx(auVar2,3,0xb);
      auVar2 = vpinsrb_avx(auVar2,3,0xc);
      auVar2 = vpinsrb_avx(auVar2,3,0xd);
      auVar2 = vpinsrb_avx(auVar2,3,0xe);
      auVar2 = vpinsrb_avx(auVar2,3,0xf);
      uStack_130 = auVar2._0_8_;
      uStack_128 = auVar2._8_8_;
      auVar3._16_8_ = uStack_130;
      auVar3._0_16_ = auVar1;
      auVar3._24_8_ = uStack_128;
      auVar3 = vpand_avx2(*pauVar10,auVar3);
      in_stack_fffffffffffff61d = 3;
      auVar1 = vpinsrb_avx(ZEXT116(3),3,1);
      auVar1 = vpinsrb_avx(auVar1,3,2);
      auVar1 = vpinsrb_avx(auVar1,3,3);
      auVar1 = vpinsrb_avx(auVar1,3,4);
      auVar1 = vpinsrb_avx(auVar1,3,5);
      auVar1 = vpinsrb_avx(auVar1,3,6);
      auVar1 = vpinsrb_avx(auVar1,3,7);
      auVar1 = vpinsrb_avx(auVar1,3,8);
      auVar1 = vpinsrb_avx(auVar1,3,9);
      auVar1 = vpinsrb_avx(auVar1,3,10);
      auVar1 = vpinsrb_avx(auVar1,3,0xb);
      auVar1 = vpinsrb_avx(auVar1,3,0xc);
      auVar1 = vpinsrb_avx(auVar1,3,0xd);
      auVar1 = vpinsrb_avx(auVar1,3,0xe);
      auVar1 = vpinsrb_avx(auVar1,3,0xf);
      auVar2 = vpinsrb_avx(ZEXT116(3),3,1);
      auVar2 = vpinsrb_avx(auVar2,3,2);
      auVar2 = vpinsrb_avx(auVar2,3,3);
      auVar2 = vpinsrb_avx(auVar2,3,4);
      auVar2 = vpinsrb_avx(auVar2,3,5);
      auVar2 = vpinsrb_avx(auVar2,3,6);
      auVar2 = vpinsrb_avx(auVar2,3,7);
      auVar2 = vpinsrb_avx(auVar2,3,8);
      auVar2 = vpinsrb_avx(auVar2,3,9);
      auVar2 = vpinsrb_avx(auVar2,3,10);
      auVar2 = vpinsrb_avx(auVar2,3,0xb);
      auVar2 = vpinsrb_avx(auVar2,3,0xc);
      auVar2 = vpinsrb_avx(auVar2,3,0xd);
      auVar2 = vpinsrb_avx(auVar2,3,0xe);
      auVar2 = vpinsrb_avx(auVar2,3,0xf);
      uStack_f0 = auVar2._0_8_;
      uStack_e8 = auVar2._8_8_;
      auVar9._16_8_ = uStack_f0;
      auVar9._0_16_ = auVar1;
      auVar9._24_8_ = uStack_e8;
      auVar4 = vpand_avx2(auVar4,auVar9);
      in_stack_fffffffffffff61e = 3;
      auVar1 = vpinsrb_avx(ZEXT116(3),3,1);
      auVar1 = vpinsrb_avx(auVar1,3,2);
      auVar1 = vpinsrb_avx(auVar1,3,3);
      auVar1 = vpinsrb_avx(auVar1,3,4);
      auVar1 = vpinsrb_avx(auVar1,3,5);
      auVar1 = vpinsrb_avx(auVar1,3,6);
      auVar1 = vpinsrb_avx(auVar1,3,7);
      auVar1 = vpinsrb_avx(auVar1,3,8);
      auVar1 = vpinsrb_avx(auVar1,3,9);
      auVar1 = vpinsrb_avx(auVar1,3,10);
      auVar1 = vpinsrb_avx(auVar1,3,0xb);
      auVar1 = vpinsrb_avx(auVar1,3,0xc);
      auVar1 = vpinsrb_avx(auVar1,3,0xd);
      auVar1 = vpinsrb_avx(auVar1,3,0xe);
      auVar1 = vpinsrb_avx(auVar1,3,0xf);
      auVar2 = vpinsrb_avx(ZEXT116(3),3,1);
      auVar2 = vpinsrb_avx(auVar2,3,2);
      auVar2 = vpinsrb_avx(auVar2,3,3);
      auVar2 = vpinsrb_avx(auVar2,3,4);
      auVar2 = vpinsrb_avx(auVar2,3,5);
      auVar2 = vpinsrb_avx(auVar2,3,6);
      auVar2 = vpinsrb_avx(auVar2,3,7);
      auVar2 = vpinsrb_avx(auVar2,3,8);
      auVar2 = vpinsrb_avx(auVar2,3,9);
      auVar2 = vpinsrb_avx(auVar2,3,10);
      auVar2 = vpinsrb_avx(auVar2,3,0xb);
      auVar2 = vpinsrb_avx(auVar2,3,0xc);
      auVar2 = vpinsrb_avx(auVar2,3,0xd);
      auVar2 = vpinsrb_avx(auVar2,3,0xe);
      auVar2 = vpinsrb_avx(auVar2,3,0xf);
      uStack_b0 = auVar2._0_8_;
      uStack_a8 = auVar2._8_8_;
      auVar8._16_8_ = uStack_b0;
      auVar8._0_16_ = auVar1;
      auVar8._24_8_ = uStack_a8;
      auVar5 = vpand_avx2(auVar5,auVar8);
      in_stack_fffffffffffff61f = 3;
      auVar1 = vpinsrb_avx(ZEXT116(3),3,1);
      auVar1 = vpinsrb_avx(auVar1,3,2);
      auVar1 = vpinsrb_avx(auVar1,3,3);
      auVar1 = vpinsrb_avx(auVar1,3,4);
      auVar1 = vpinsrb_avx(auVar1,3,5);
      auVar1 = vpinsrb_avx(auVar1,3,6);
      auVar1 = vpinsrb_avx(auVar1,3,7);
      auVar1 = vpinsrb_avx(auVar1,3,8);
      auVar1 = vpinsrb_avx(auVar1,3,9);
      auVar1 = vpinsrb_avx(auVar1,3,10);
      auVar1 = vpinsrb_avx(auVar1,3,0xb);
      auVar1 = vpinsrb_avx(auVar1,3,0xc);
      auVar1 = vpinsrb_avx(auVar1,3,0xd);
      auVar1 = vpinsrb_avx(auVar1,3,0xe);
      auVar1 = vpinsrb_avx(auVar1,3,0xf);
      auVar2 = vpinsrb_avx(ZEXT116(3),3,1);
      auVar2 = vpinsrb_avx(auVar2,3,2);
      auVar2 = vpinsrb_avx(auVar2,3,3);
      auVar2 = vpinsrb_avx(auVar2,3,4);
      auVar2 = vpinsrb_avx(auVar2,3,5);
      auVar2 = vpinsrb_avx(auVar2,3,6);
      auVar2 = vpinsrb_avx(auVar2,3,7);
      auVar2 = vpinsrb_avx(auVar2,3,8);
      auVar2 = vpinsrb_avx(auVar2,3,9);
      auVar2 = vpinsrb_avx(auVar2,3,10);
      auVar2 = vpinsrb_avx(auVar2,3,0xb);
      auVar2 = vpinsrb_avx(auVar2,3,0xc);
      auVar2 = vpinsrb_avx(auVar2,3,0xd);
      auVar2 = vpinsrb_avx(auVar2,3,0xe);
      auVar2 = vpinsrb_avx(auVar2,3,0xf);
      auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      uStack_70 = auVar13._0_8_;
      uStack_68 = auVar13._8_8_;
      auVar7._16_8_ = uStack_70;
      auVar7._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar7._24_8_ = uStack_68;
      auVar6 = vpand_avx2(auVar6,auVar7);
      auVar3 = vpmaddubsw_avx2(auVar3,*(undefined1 (*) [32])
                                       (in_R9 + (long)local_824 * 0x124 + 4 + local_888 * 4));
      auVar4 = vpmaddubsw_avx2(auVar4,*(undefined1 (*) [32])
                                       (in_R9 + (long)local_824 * 0x124 + local_888 * 4 + 0x24));
      auVar5 = vpmaddubsw_avx2(auVar5,*(undefined1 (*) [32])
                                       (in_R9 + (long)local_824 * 0x124 + local_888 * 4 + 0x44));
      auVar6 = vpmaddubsw_avx2(auVar6,*(undefined1 (*) [32])
                                       (in_R9 + (long)local_824 * 0x124 + local_888 * 4 + 100));
      auVar3 = vpaddw_avx2(auVar3,auVar4);
      local_860 = vpaddw_avx2(local_860,auVar3);
      auVar3 = vpaddw_avx2(auVar5,auVar6);
      local_880 = vpaddw_avx2(local_880,auVar3);
    }
    auVar4 = *(undefined1 (*) [32])(in_R9 + 0x104 + (long)local_824 * 0x124);
    fVar12 = *(float *)(in_R9 + (long)local_824 * 0x124);
    fVar11 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RCX + 0x40 + (long)local_824 * 0x42));
    fVar12 = fVar12 * fVar11;
    auVar1 = vinsertps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)fVar12),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)fVar12),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar12),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar12),0x30);
    local_180 = auVar1._0_8_;
    uStack_178 = auVar1._8_8_;
    uStack_170 = auVar2._0_8_;
    auVar3 = vpaddw_avx2(local_860,local_880);
    auVar3 = vpsubw_avx2(auVar3,auVar4);
    in_stack_fffffffffffff61a = 1;
    auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar1 = vpinsrw_avx(auVar1,1,2);
    auVar1 = vpinsrw_avx(auVar1,1,3);
    auVar1 = vpinsrw_avx(auVar1,1,4);
    auVar1 = vpinsrw_avx(auVar1,1,5);
    auVar1 = vpinsrw_avx(auVar1,1,6);
    auVar1 = vpinsrw_avx(auVar1,1,7);
    auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar2 = vpinsrw_avx(auVar2,1,2);
    auVar2 = vpinsrw_avx(auVar2,1,3);
    auVar2 = vpinsrw_avx(auVar2,1,4);
    auVar2 = vpinsrw_avx(auVar2,1,5);
    auVar2 = vpinsrw_avx(auVar2,1,6);
    auVar2 = vpinsrw_avx(auVar2,1,7);
    auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    uStack_290 = auVar13._0_8_;
    uStack_288 = auVar13._8_8_;
    auVar4._16_8_ = uStack_290;
    auVar4._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    auVar4._24_8_ = uStack_288;
    auVar3 = vpmaddwd_avx2(auVar3,auVar4);
    vcvtdq2ps_avx(auVar3);
    in_stack_fffffffffffff620 = local_180;
    in_stack_fffffffffffff628 = uStack_178;
    in_stack_fffffffffffff630 = uStack_170;
  }
  x_00[0]._2_2_ = in_stack_fffffffffffff61a;
  x_00[0]._0_2_ = in_stack_fffffffffffff618;
  x_00[1]._0_1_ = in_stack_fffffffffffff61c;
  x_00[1]._1_1_ = in_stack_fffffffffffff61d;
  x_00[1]._2_1_ = in_stack_fffffffffffff61e;
  x_00[1]._3_1_ = in_stack_fffffffffffff61f;
  x_00[2] = (float)(int)in_stack_fffffffffffff620;
  x_00[3] = (float)(int)((ulong)in_stack_fffffffffffff620 >> 0x20);
  x_00[4] = (float)(int)in_stack_fffffffffffff628;
  x_00[5] = (float)(int)((ulong)in_stack_fffffffffffff628 >> 0x20);
  x_00[6] = (float)(int)in_stack_fffffffffffff630;
  x_00[7] = (float)(int)((ulong)in_stack_fffffffffffff630 >> 0x20);
  fVar12 = hsum_float_8(x_00);
  *in_RSI = fVar12;
  return;
}

Assistant:

void ggml_vec_dot_tq2_0_q8_K(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_tq2_0 * GGML_RESTRICT x = vx;
    const block_q8_K  * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

#if defined(__ARM_NEON)
    float sumf = 0.0f;

    const uint8x16_t m3 = vdupq_n_u8(3);

    for (int i = 0; i < nb; ++i) {
#if defined(__ARM_FEATURE_DOTPROD)
        int32x4_t sumi0 = vdupq_n_s32(0);
        int32x4_t sumi1 = vdupq_n_s32(0);
#else
        int16x8_t sumi0 = vdupq_n_s16(0);
        int16x8_t sumi1 = vdupq_n_s16(0);
#endif

        for (size_t j = 0; j < sizeof(x->qs); j += 32) {
            uint8x16_t qx0 = vld1q_u8(x[i].qs + j);
            uint8x16_t qx1 = vld1q_u8(x[i].qs + j + 16);
            uint8x16_t qx2 = vshrq_n_u8(qx0, 2);
            uint8x16_t qx3 = vshrq_n_u8(qx1, 2);
            uint8x16_t qx4 = vshrq_n_u8(qx0, 4);
            uint8x16_t qx5 = vshrq_n_u8(qx1, 4);
            uint8x16_t qx6 = vshrq_n_u8(qx0, 6);
            uint8x16_t qx7 = vshrq_n_u8(qx1, 6);

            int8x16_t sqx0 = vreinterpretq_s8_u8(vandq_u8(qx0, m3));
            int8x16_t sqx1 = vreinterpretq_s8_u8(vandq_u8(qx1, m3));
            int8x16_t sqx2 = vreinterpretq_s8_u8(vandq_u8(qx2, m3));
            int8x16_t sqx3 = vreinterpretq_s8_u8(vandq_u8(qx3, m3));
            int8x16_t sqx4 = vreinterpretq_s8_u8(vandq_u8(qx4, m3));
            int8x16_t sqx5 = vreinterpretq_s8_u8(vandq_u8(qx5, m3));
            int8x16_t sqx6 = vreinterpretq_s8_u8(vandq_u8(qx6, m3));
            int8x16_t sqx7 = vreinterpretq_s8_u8(vandq_u8(qx7, m3));

            const int8x16_t qy0 = vld1q_s8(y[i].qs + j*4 +   0);
            const int8x16_t qy1 = vld1q_s8(y[i].qs + j*4 +  16);
            const int8x16_t qy2 = vld1q_s8(y[i].qs + j*4 +  32);
            const int8x16_t qy3 = vld1q_s8(y[i].qs + j*4 +  48);
            const int8x16_t qy4 = vld1q_s8(y[i].qs + j*4 +  64);
            const int8x16_t qy5 = vld1q_s8(y[i].qs + j*4 +  80);
            const int8x16_t qy6 = vld1q_s8(y[i].qs + j*4 +  96);
            const int8x16_t qy7 = vld1q_s8(y[i].qs + j*4 + 112);

#if defined(__ARM_FEATURE_DOTPROD)
            sumi0 = vdotq_s32(sumi0, sqx0, qy0);
            sumi1 = vdotq_s32(sumi1, sqx1, qy1);
            sumi0 = vdotq_s32(sumi0, sqx2, qy2);
            sumi1 = vdotq_s32(sumi1, sqx3, qy3);
            sumi0 = vdotq_s32(sumi0, sqx4, qy4);
            sumi1 = vdotq_s32(sumi1, sqx5, qy5);
            sumi0 = vdotq_s32(sumi0, sqx6, qy6);
            sumi1 = vdotq_s32(sumi1, sqx7, qy7);
#else
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx0), vget_low_s8(qy0));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx0), vget_high_s8(qy0));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx1), vget_low_s8(qy1));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx1), vget_high_s8(qy1));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx2), vget_low_s8(qy2));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx2), vget_high_s8(qy2));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx3), vget_low_s8(qy3));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx3), vget_high_s8(qy3));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx4), vget_low_s8(qy4));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx4), vget_high_s8(qy4));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx5), vget_low_s8(qy5));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx5), vget_high_s8(qy5));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx6), vget_low_s8(qy6));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx6), vget_high_s8(qy6));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx7), vget_low_s8(qy7));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx7), vget_high_s8(qy7));
#endif
        }

        const int16x8_t ysum0 = vld1q_s16(y[i].bsums);
        const int16x8_t ysum1 = vld1q_s16(y[i].bsums + 8);

        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;

#if defined(__ARM_FEATURE_DOTPROD)
        sumi0 = vaddq_s32(sumi0, sumi1);
        sumi0 = vsubq_s32(sumi0, vpaddlq_s16(vaddq_s16(ysum0, ysum1)));

        sumf += d * (float) vaddvq_s32(sumi0);
#else
        sumi0 = vaddq_s16(sumi0, sumi1);
        sumi0 = vsubq_s16(sumi0, vaddq_s16(ysum0, ysum1));

        sumf += d * (float) vaddlvq_s16(sumi0);
#endif
    }

    *s = sumf;

#elif defined(__AVX2__)
    __m256 sumf = _mm256_setzero_ps();

    for (int i = 0; i < nb; ++i) {
        // 16-bit sums, because 256*127 still fits
        __m256i sumi0 = _mm256_setzero_si256();
        __m256i sumi1 = _mm256_setzero_si256();

        for (size_t j = 0; j < sizeof(x->qs); j += 32) {
            __m256i qx0 = _mm256_loadu_si256((const __m256i *) (x[i].qs + j));
            __m256i qx1 = _mm256_srli_epi16(qx0, 2);
            __m256i qx2 = _mm256_srli_epi16(qx0, 4);
            __m256i qx3 = _mm256_srli_epi16(qx0, 6);

            // 0, 1, 2 (should not be 3)
            qx0 = _mm256_and_si256(qx0, _mm256_set1_epi8(3));
            qx1 = _mm256_and_si256(qx1, _mm256_set1_epi8(3));
            qx2 = _mm256_and_si256(qx2, _mm256_set1_epi8(3));
            qx3 = _mm256_and_si256(qx3, _mm256_set1_epi8(3));

            const __m256i qy0 = _mm256_loadu_si256((const __m256i *) (y[i].qs + j*4 +  0));
            const __m256i qy1 = _mm256_loadu_si256((const __m256i *) (y[i].qs + j*4 + 32));
            const __m256i qy2 = _mm256_loadu_si256((const __m256i *) (y[i].qs + j*4 + 64));
            const __m256i qy3 = _mm256_loadu_si256((const __m256i *) (y[i].qs + j*4 + 96));

            qx0 = _mm256_maddubs_epi16(qx0, qy0);
            qx1 = _mm256_maddubs_epi16(qx1, qy1);
            qx2 = _mm256_maddubs_epi16(qx2, qy2);
            qx3 = _mm256_maddubs_epi16(qx3, qy3);

            sumi0 = _mm256_add_epi16(sumi0, _mm256_add_epi16(qx0, qx1));
            sumi1 = _mm256_add_epi16(sumi1, _mm256_add_epi16(qx2, qx3));
        }

        const __m256i ysum = _mm256_loadu_si256((const __m256i *) y[i].bsums);
        const __m256 d = _mm256_set1_ps(y[i].d * GGML_FP16_TO_FP32(x[i].d));

        sumi0 = _mm256_add_epi16(sumi0, sumi1);
        sumi0 = _mm256_sub_epi16(sumi0, ysum);
        sumi0 = _mm256_madd_epi16(sumi0, _mm256_set1_epi16(1));

        sumf = _mm256_add_ps(_mm256_mul_ps(_mm256_cvtepi32_ps(sumi0), d), sumf);
    }

    *s = hsum_float_8(sumf);

#else
    float sumf = 0.0f;

    for (int i = 0; i < nb; ++i) {
        int32_t sumi = 0;

        for (size_t j = 0; j < sizeof(x->qs); j += 32) {
            for (size_t l = 0; l < 4; ++l) {
                for (size_t k = 0; k < 32; ++k) {
                    sumi += y[i].qs[j*4 + l*32 + k] * (((x[i].qs[j + k] >> (l*2)) & 3) - 1);
                }
            }
        }

        const float d = y[i].d * GGML_FP16_TO_FP32(x[i].d);

        sumf += (float) sumi * d;
    }

    *s = sumf;
#endif
}